

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMaj.c
# Opt level: O1

int Gem_Enumerate(int nVars,int fDump,int fVerbose)

{
  uint uVar1;
  Vec_Mem_t *pVVar2;
  word *pwVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  Gem_Man_t *p;
  FILE *__stream;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  undefined4 in_register_0000003c;
  uint uVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  timespec ts;
  timespec local_418 [62];
  
  iVar5 = clock_gettime(3,local_418);
  if (iVar5 < 0) {
    lVar13 = -1;
  }
  else {
    lVar13 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
  }
  p = Gem_ManAlloc(nVars,fVerbose);
  if (2 < nVars) {
    uVar15 = 1;
    uVar7 = 1;
    do {
      uVar1 = p->nObjs;
      uVar14 = (uint)uVar15;
      printf("Expanding  var %2d (functions = %10d)  ",uVar15);
      iVar10 = 3;
      iVar5 = clock_gettime(3,local_418);
      if (iVar5 < 0) {
        lVar8 = -1;
      }
      else {
        lVar8 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
      }
      Abc_Print(iVar10,"%s =","Time");
      Abc_Print(iVar10,"%9.2f sec\n",(double)(lVar8 - lVar13) / 1000000.0);
      if (0 < (int)uVar1) {
        uVar9 = 0;
        do {
          uVar6 = *(uint *)(p->pObjs + uVar9) & 0xf;
          if ((uVar14 == uVar6) || (((long)(int)uVar7 <= (long)uVar9 && (uVar6 < uVar14)))) {
            uVar6 = 0;
            do {
              if ((*(ushort *)&p->pObjs[uVar9].field_0x2 >> (uVar6 & 0x1f) & 1) != 0) {
                Gem_FuncExpand(p,(int)uVar9,uVar6);
              }
              uVar6 = uVar6 + 1;
            } while (uVar14 != uVar6);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar1);
      }
      printf("Connecting var %2d (functions = %10d)  ",uVar15,(ulong)(uint)p->nObjs);
      iVar10 = 3;
      iVar5 = clock_gettime(3,local_418);
      if (iVar5 < 0) {
        lVar8 = -1;
      }
      else {
        lVar8 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
      }
      Abc_Print(iVar10,"%s =","Time");
      Abc_Print(iVar10,"%9.2f sec\n",(double)(lVar8 - lVar13) / 1000000.0);
      if ((int)uVar1 < p->nObjs) {
        lVar8 = (long)(int)uVar1;
        do {
          uVar7 = *(uint *)(p->pObjs + lVar8);
          if ((uVar7 & 0xf) != 0) {
            uVar6 = 0;
            do {
              if ((((uVar7 >> 0x10) >> (uVar6 & 0x1f) & 1) != 0) &&
                 (uVar7 = *(uint *)(p->pObjs + lVar8), uVar11 = uVar6, uVar6 + 1 < (uVar7 & 0xf))) {
                do {
                  if (((uVar7 >> 0x10) >> ((byte)uVar11 & 0x1f) & 2) != 0) {
                    Gem_FuncReduce(p,(int)lVar8,uVar6,uVar11 + 1);
                  }
                  uVar7 = *(uint *)(p->pObjs + lVar8);
                  uVar12 = uVar11 + 2;
                  uVar11 = uVar11 + 1;
                } while (uVar12 < (uVar7 & 0xf));
              }
              uVar6 = uVar6 + 1;
              uVar7 = *(uint *)(p->pObjs + lVar8);
            } while (uVar6 < (uVar7 & 0xf));
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < p->nObjs);
      }
      uVar15 = (ulong)(uVar14 + 1);
      uVar7 = uVar1;
    } while (uVar14 != nVars - 2U);
  }
  printf("Finished          (functions = %10d)  ",(ulong)(uint)p->nObjs);
  iVar10 = 3;
  iVar5 = clock_gettime(3,local_418);
  if (iVar5 < 0) {
    lVar8 = -1;
  }
  else {
    lVar8 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
  }
  Abc_Print(iVar10,"%s =","Time");
  Abc_Print(iVar10,"%9.2f sec\n",(double)(lVar8 - lVar13) / 1000000.0);
  if (fDump != 0) {
    pVVar2 = p->vTtMem;
    sprintf((char *)local_418,"tt_%s_%02d.txt","enum",CONCAT44(in_register_0000003c,nVars));
    __stream = fopen((char *)local_418,"wb");
    if (_stdout == __stream) {
      printf("Memory vector has %d entries: \n",(ulong)(uint)pVVar2->nEntries);
    }
    if (0 < pVVar2->nEntries) {
      uVar7 = 0;
      do {
        pwVar3 = pVVar2->ppPages[uVar7 >> ((byte)pVVar2->LogPageSze & 0x1f)];
        if (pwVar3 == (word *)0x0) break;
        uVar1 = pVVar2->nEntrySize;
        if (0 < (int)uVar1) {
          uVar14 = pVVar2->PageMask;
          uVar15 = (ulong)uVar1;
          do {
            lVar13 = 0x3c;
            do {
              uVar6 = (uint)(pwVar3[(long)(int)((uVar14 & uVar7) * uVar1) + (uVar15 - 1)] >>
                            ((byte)lVar13 & 0x3f)) & 0xf;
              if (uVar6 < 10) {
                fprintf(__stream,"%d");
              }
              else {
                fputc(uVar6 + 0x37,__stream);
              }
              lVar13 = lVar13 + -4;
            } while (lVar13 != -4);
            bVar4 = 1 < (long)uVar15;
            uVar15 = uVar15 - 1;
          } while (bVar4);
        }
        fputc(10,__stream);
        uVar7 = uVar7 + 1;
      } while ((int)uVar7 < pVVar2->nEntries);
    }
    if (__stream != _stdout) {
      fclose(__stream);
    }
    printf("Dumped %d %d-var truth tables into file \"%s\" (%.2f MB).\n",
           (double)pVVar2->nEntrySize * (double)pVVar2->nEntries * 8.0 * 9.5367431640625e-07,
           (ulong)(uint)pVVar2->nEntries,CONCAT44(in_register_0000003c,nVars),local_418);
  }
  Gem_ManFree(p);
  return 0;
}

Assistant:

int Gem_Enumerate( int nVars, int fDump, int fVerbose )
{
    abctime clk = Abc_Clock();
    Gem_Man_t * p = Gem_ManAlloc( nVars, fVerbose );
    int v, f, i, j, nObjsStop = 1;
    for ( v = 1; v <= nVars-2; v++ )
    {
        // expand functions by adding a gate
        int nObjsStopPrev = nObjsStop;
        nObjsStop = p->nObjs;
        printf( "Expanding  var %2d (functions = %10d)  ", v, p->nObjs );
        Abc_PrintTime( 0, "Time", Abc_Clock() - clk );
        for ( f = 0; f < nObjsStop; f++ )
            if ( v == (int)p->pObjs[f].nVars || (v > (int)p->pObjs[f].nVars && f >= nObjsStopPrev) )
                for ( i = 0; i < v; i++ )
                    if ( (int)p->pObjs[f].Groups & (1 << i) )
                        Gem_FuncExpand( p, f, i );
        // reduce functions by adding a crossbar
        printf( "Connecting var %2d (functions = %10d)  ", v, p->nObjs );
        Abc_PrintTime( 0, "Time", Abc_Clock() - clk );
        for ( f = nObjsStop; f < p->nObjs; f++ )
            for ( i = 0; i < (int)p->pObjs[f].nVars; i++ )
                if ( (int)p->pObjs[f].Groups & (1 << i) )
                    for ( j = i+1; j < (int)p->pObjs[f].nVars; j++ )
                        if ( (int)p->pObjs[f].Groups & (1 << j) )
                            if ( Gem_FuncReduce( p, f, i, j ) )
                                return Gem_ManFree( p );
    }
    printf( "Finished          (functions = %10d)  ", p->nObjs );
    Abc_PrintTime( 0, "Time", Abc_Clock() - clk );
    if ( fDump ) Vec_MemDumpTruthTables( p->vTtMem, "enum", nVars );
    Gem_ManFree( p );
    return 0;
}